

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

bool __thiscall
re2::NFA::Search(NFA *this,StringPiece *text,StringPiece *const_context,bool anchored,bool longest,
                StringPiece *submatch,int nsubmatch)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  char **ppcVar5;
  Inst *pIVar6;
  undefined8 uVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  char **ppcVar12;
  Threadq *nextq;
  Thread *pTVar13;
  ostream *poVar14;
  pointer pIVar15;
  bool bVar16;
  byte *pbVar17;
  long lVar18;
  uint32 flag;
  byte *p;
  uint uVar19;
  ulong uVar20;
  Threadq *runq;
  Threadq *pTVar21;
  StringPiece context;
  StringPiece local_1d8;
  Threadq *local_1c0;
  StringPiece *local_1b8;
  LogMessage local_1b0;
  
  if (this->start_ == 0) {
    return false;
  }
  pbVar17 = (byte *)const_context->ptr_;
  local_1d8.length_ = const_context->length_;
  local_1d8._12_4_ = *(undefined4 *)&const_context->field_0xc;
  if (pbVar17 == (byte *)0x0) {
    local_1d8.length_ = text->length_;
    pbVar17 = (byte *)text->ptr_;
  }
  p = (byte *)text->ptr_;
  local_1d8.ptr_ = (char *)pbVar17;
  if (pbVar17 <= p) {
    pbVar11 = p + text->length_;
    if (pbVar11 <= pbVar17 + local_1d8.length_) {
      bVar1 = this->prog_->anchor_start_;
      if ((pbVar17 != p & bVar1) != 0) {
        return false;
      }
      if (this->prog_->anchor_end_ == true) {
        if (pbVar17 + local_1d8.length_ != pbVar11) {
          return false;
        }
        this->endmatch_ = true;
        this->etext_ = (char *)pbVar11;
        longest = true;
      }
      if (-1 < nsubmatch) {
        uVar10 = nsubmatch * 2;
        this->ncapture_ = uVar10;
        this->longest_ = longest;
        if (nsubmatch == 0) {
          this->ncapture_ = 2;
          uVar10 = 2;
        }
        local_1b8 = submatch;
        ppcVar12 = (char **)operator_new__((ulong)uVar10 << 3);
        this->match_ = ppcVar12;
        this->matched_ = false;
        this->btext_ = (char *)pbVar17;
        bVar8 = false;
        (this->q0_).size_ = 0;
        (this->q1_).size_ = 0;
        memset(ppcVar12,0,(ulong)uVar10 << 3);
        if (pbVar17 < p) {
          bVar2 = p[-1];
          bVar8 = (bVar2 == 0x5f || (byte)(bVar2 - 0x30) < 10) ||
                  (byte)((bVar2 & 0xdf) + 0xbf) < 0x1a;
        }
        nextq = &this->q1_;
        runq = &this->q0_;
        do {
          if (p == (byte *)local_1d8.ptr_) {
            uVar10 = 5;
          }
          else {
            uVar10 = 0;
            if (p <= local_1d8.ptr_ + local_1d8.length_) {
              uVar10 = (uint)(p[-1] == 10);
            }
          }
          pbVar17 = (byte *)(local_1d8.ptr_ + local_1d8.length_);
          if (p == pbVar17) {
            uVar9 = uVar10 | 10;
          }
          else {
            uVar9 = uVar10;
            if ((p < pbVar17) && (uVar9 = uVar10 | 2, *p != 10)) {
              uVar9 = uVar10;
            }
          }
          bVar16 = false;
          if (p < pbVar17) {
            bVar2 = *p;
            bVar16 = (bVar2 == 0x5f || (byte)(bVar2 - 0x30) < 10) ||
                     (byte)((bVar2 & 0xdf) + 0xbf) < 0x1a;
          }
          uVar10 = 0xffffffff;
          if (p < text->ptr_ + text->length_) {
            uVar10 = (uint)*p;
          }
          flag = (uint)(bVar16 == bVar8) * 0x10 + uVar9 + 0x10;
          uVar10 = Step(this,runq,nextq,uVar10,flag,(char *)(p + -1));
          if (runq->size_ != 0) {
            __assert_fail("(runq->size()) == (0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                          ,0x22b,
                          "bool re2::NFA::Search(const StringPiece &, const StringPiece &, bool, bool, StringPiece *, int)"
                         );
          }
          pbVar17 = (byte *)(text->ptr_ + text->length_);
          if (uVar10 != 0) {
            iVar4 = this->ncapture_;
            goto LAB_001283ec;
          }
          if (pbVar17 < p) goto LAB_00128485;
          pTVar21 = nextq;
          bVar8 = bVar16;
          if (this->matched_ == false) {
            if (bVar1 == false && !anchored) {
              uVar10 = Prog::first_byte(this->prog_);
              if ((((-1 < (int)uVar10) && (nextq->size_ == 0)) &&
                  (pbVar17 = (byte *)(text->ptr_ + text->length_), p < pbVar17)) && (uVar10 != *p))
              {
                p = (byte *)memchr(p,uVar10,(long)pbVar17 - (long)p);
                if (p == (byte *)0x0) {
                  bVar16 = false;
                  p = pbVar17;
                }
                else {
                  bVar2 = *p;
                  bVar16 = (bVar2 == 0x5f || (byte)(bVar2 - 0x30) < 10) ||
                           (byte)((bVar2 & 0xdf) + 0xbf) < 0x1a;
                }
                flag = Prog::EmptyFlags(&local_1d8,(char *)p);
              }
            }
            else {
              if (p != (byte *)text->ptr_) goto LAB_001282c3;
              Prog::first_byte(this->prog_);
            }
            pTVar13 = this->free_threads_;
            local_1c0 = nextq;
            if (pTVar13 == (Thread *)0x0) {
              pTVar13 = (Thread *)operator_new(0x10);
              (pTVar13->field_0).ref = 1;
              uVar10 = this->ncapture_;
              uVar20 = (long)(int)uVar10 * 8;
              if ((long)(int)uVar10 < 0) {
                uVar20 = 0xffffffffffffffff;
              }
              ppcVar12 = (char **)operator_new__(uVar20);
              pTVar13->capture = ppcVar12;
            }
            else {
              this->free_threads_ = (Thread *)pTVar13->field_0;
              (pTVar13->field_0).ref = 1;
              ppcVar12 = pTVar13->capture;
              uVar10 = this->ncapture_;
            }
            pTVar21 = local_1c0;
            if (0 < (int)uVar10) {
              ppcVar5 = this->match_;
              uVar20 = 0;
              do {
                ppcVar12[uVar20] = ppcVar5[uVar20];
                ppcVar12[uVar20 + 1] = ppcVar5[uVar20 + 1];
                uVar20 = uVar20 + 2;
              } while (uVar20 < uVar10);
              ppcVar12 = pTVar13->capture;
            }
            *ppcVar12 = (char *)p;
            uVar10 = 0xffffffff;
            if (p < text->ptr_ + text->length_) {
              uVar10 = (uint)*p;
            }
            AddToThreadq(this,local_1c0,this->start_,uVar10,flag,(char *)p,pTVar13);
            iVar3 = (pTVar13->field_0).ref;
            iVar4 = iVar3 + -1;
            (pTVar13->field_0).ref = iVar4;
            bVar8 = bVar16;
            if (iVar3 < 2) {
              if (iVar4 != 0) goto LAB_00128545;
              pTVar13->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
              this->free_threads_ = pTVar13;
            }
          }
LAB_001282c3:
          p = p + 1;
          nextq = runq;
          runq = pTVar21;
        } while (pTVar21->size_ != 0);
        goto LAB_001284d2;
      }
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x1d1
                 ,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,"Bad args: nsubmatch=",0x14);
      std::ostream::operator<<((ostream *)&local_1b0.str_,nsubmatch);
      goto LAB_00128386;
    }
  }
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x1bd,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0.str_,"Bad args: context does not contain text ",0x28);
  poVar14 = std::ostream::_M_insert<void_const*>(&local_1b0.str_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"+",1);
  poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,local_1d8.length_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
  poVar14 = std::ostream::_M_insert<void_const*>(poVar14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"+",1);
  std::ostream::operator<<((ostream *)poVar14,text->length_);
LAB_00128386:
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  return false;
LAB_001283ec:
  pIVar6 = this->prog_->inst_;
  uVar9 = pIVar6[(int)uVar10].out_opcode_;
  uVar19 = uVar9 & 7;
  if (uVar19 == 3) {
    if (pIVar6[(int)uVar10].field_1.cap_ < iVar4) {
      this->match_[pIVar6[(int)uVar10].field_1.cap_] = (char *)pbVar17;
    }
  }
  else if (uVar19 != 6) goto LAB_00128421;
  uVar10 = uVar9 >> 4;
  goto LAB_001283ec;
LAB_00128421:
  if (uVar19 == 5) {
    this->match_[1] = (char *)pbVar17;
    this->matched_ = true;
  }
  else {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x235,3
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"Unexpected opcode in short circuit: ",0x24);
    std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar6[(int)uVar10].out_opcode_ & 7);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
LAB_00128485:
  if (nextq->size_ != 0) {
    pIVar15 = (nextq->dense_).
              super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pTVar13 = pIVar15->second;
      if (pTVar13 != (Thread *)0x0) {
        iVar3 = (pTVar13->field_0).ref;
        iVar4 = iVar3 + -1;
        (pTVar13->field_0).ref = iVar4;
        if (iVar3 < 2) {
          if (iVar4 != 0) {
LAB_00128545:
            __assert_fail("(t->ref) == (0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                          ,0xb7,"void re2::NFA::Decref(Thread *)");
          }
          pTVar13->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
          this->free_threads_ = pTVar13;
        }
      }
      pIVar15 = pIVar15 + 1;
    } while (pIVar15 !=
             (nextq->dense_).
             super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
             ._M_impl.super__Vector_impl_data._M_start + nextq->size_);
  }
LAB_001284d2:
  if (this->matched_ == true && nsubmatch != 0) {
    ppcVar12 = this->match_;
    lVar18 = 0;
    do {
      uVar7 = *(undefined8 *)((long)ppcVar12 + lVar18);
      iVar4 = *(int *)((long)ppcVar12 + lVar18 + 8);
      *(undefined8 *)((long)&local_1b8->ptr_ + lVar18) = uVar7;
      *(int *)((long)&local_1b8->length_ + lVar18) = iVar4 - (int)uVar7;
      lVar18 = lVar18 + 0x10;
    } while ((ulong)(uint)nsubmatch << 4 != lVar18);
    return true;
  }
  return this->matched_;
}

Assistant:

bool NFA::Search(const StringPiece& text, const StringPiece& const_context,
            bool anchored, bool longest,
            StringPiece* submatch, int nsubmatch) {
  if (start_ == 0)
    return false;

  StringPiece context = const_context;
  if (context.begin() == NULL)
    context = text;

  if (!StringPieceContains(context, text)) {
    LOG(FATAL) << "Bad args: context does not contain text "
                << reinterpret_cast<const void*>(context.begin())
                << "+" << context.size() << " "
                << reinterpret_cast<const void*>(text.begin())
                << "+" << text.size();
    return false;
  }

  if (prog_->anchor_start() && context.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context.end() != text.end())
    return false;
  anchored |= prog_->anchor_start();
  if (prog_->anchor_end()) {
    longest = true;
    endmatch_ = true;
    etext_ = text.end();
  }

  if (nsubmatch < 0) {
    LOG(DFATAL) << "Bad args: nsubmatch=" << nsubmatch;
    return false;
  }

  // Save search parameters.
  ncapture_ = 2*nsubmatch;
  longest_ = longest;

  if (nsubmatch == 0) {
    // We need to maintain match[0], both to distinguish the
    // longest match (if longest is true) and also to tell
    // whether we've seen any matches at all.
    ncapture_ = 2;
  }

  match_ = new const char*[ncapture_];
  matched_ = false;

  // For debugging prints.
  btext_ = context.begin();

  if (Debug) {
    fprintf(stderr, "NFA::Search %s (context: %s) anchored=%d longest=%d\n",
            text.as_string().c_str(), context.as_string().c_str(), anchored,
            longest);
  }

  // Set up search.
  Threadq* runq = &q0_;
  Threadq* nextq = &q1_;
  runq->clear();
  nextq->clear();
  memset(&match_[0], 0, ncapture_*sizeof match_[0]);
  int wasword = 0;

  if (text.begin() > context.begin())
    wasword = Prog::IsWordChar(text.begin()[-1] & 0xFF);

  // Loop over the text, stepping the machine.
  for (const char* p = text.begin();; p++) {
    // Check for empty-width specials.
    int flag = 0;

    // ^ and \A
    if (p == context.begin())
      flag |= kEmptyBeginText | kEmptyBeginLine;
    else if (p <= context.end() && p[-1] == '\n')
      flag |= kEmptyBeginLine;

    // $ and \z
    if (p == context.end())
      flag |= kEmptyEndText | kEmptyEndLine;
    else if (p < context.end() && p[0] == '\n')
      flag |= kEmptyEndLine;

    // \b and \B
    int isword = 0;
    if (p < context.end())
      isword = Prog::IsWordChar(p[0] & 0xFF);

    if (isword != wasword)
      flag |= kEmptyWordBoundary;
    else
      flag |= kEmptyNonWordBoundary;

    if (Debug) {
      int c = 0;
      if (p == context.begin())
        c = '^';
      else if (p > text.end())
        c = '$';
      else if (p < text.end())
        c = p[0] & 0xFF;

      fprintf(stderr, "%c[%#x/%d/%d]:", c, flag, isword, wasword);
      for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
        Thread* t = i->second;
        if (t == NULL)
          continue;
        fprintf(stderr, " %d%s", i->index(), FormatCapture(t->capture).c_str());
      }
      fprintf(stderr, "\n");
    }

    // Note that we pass p-1 to Step() because it needs the previous pointer
    // value in order to handle Match instructions appropriately. It plumbs
    // c and flag through to AddToThreadq() along with p-1+1, which is p.
    //
    // This is a no-op the first time around the loop because runq is empty.
    int id = Step(runq, nextq, p < text.end() ? p[0] & 0xFF : -1, flag, p-1);
    DCHECK_EQ(runq->size(), 0);
    swap(nextq, runq);
    nextq->clear();
    if (id != 0) {
      // We're done: full match ahead.
      p = text.end();
      for (;;) {
        Prog::Inst* ip = prog_->inst(id);
        switch (ip->opcode()) {
          default:
            LOG(DFATAL) << "Unexpected opcode in short circuit: " << ip->opcode();
            break;

          case kInstCapture:
            if (ip->cap() < ncapture_)
              match_[ip->cap()] = p;
            id = ip->out();
            continue;

          case kInstNop:
            id = ip->out();
            continue;

          case kInstMatch:
            match_[1] = p;
            matched_ = true;
            break;
        }
        break;
      }
      break;
    }

    if (p > text.end())
      break;

    // Start a new thread if there have not been any matches.
    // (No point in starting a new thread if there have been
    // matches, since it would be to the right of the match
    // we already found.)
    if (!matched_ && (!anchored || p == text.begin())) {
      // If there's a required first byte for an unanchored search
      // and we're not in the middle of any possible matches,
      // use memchr to search for the byte quickly.
      int fb = prog_->first_byte();
      if (!anchored && runq->size() == 0 &&
          fb >= 0 && p < text.end() && (p[0] & 0xFF) != fb) {
        p = reinterpret_cast<const char*>(memchr(p, fb, text.end() - p));
        if (p == NULL) {
          p = text.end();
          isword = 0;
        } else {
          isword = Prog::IsWordChar(p[0] & 0xFF);
        }
        flag = Prog::EmptyFlags(context, p);
      }

      Thread* t = AllocThread();
      CopyCapture(t->capture, match_);
      t->capture[0] = p;
      AddToThreadq(runq, start_, p < text.end() ? p[0] & 0xFF : -1, flag, p, t);
      Decref(t);
    }

    // If all the threads have died, stop early.
    if (runq->size() == 0) {
      if (Debug)
        fprintf(stderr, "dead\n");
      break;
    }

    wasword = isword;
  }

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i)
    Decref(i->second);

  if (matched_) {
    for (int i = 0; i < nsubmatch; i++)
      submatch[i].set(match_[2*i],
                      static_cast<int>(match_[2*i+1] - match_[2*i]));
    if (Debug)
      fprintf(stderr, "match (%d,%d)\n",
              static_cast<int>(match_[0] - btext_),
              static_cast<int>(match_[1] - btext_));
    return true;
  }
  VLOG(1) << "No matches found";
  return false;
}